

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O1

EffectiveSign __thiscall
slang::ast::CallExpression::getEffectiveSignImpl(CallExpression *this,bool param_1)

{
  bool bVar1;
  int iVar2;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar3;
  undefined4 extraout_var;
  
  if ((this->subroutine).
      super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      ._M_index == '\x01') {
    pvVar3 = std::
             get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       (&this->subroutine);
    iVar2 = (*((pvVar3->subroutine).ptr)->_vptr_SystemSubroutine[6])();
    if ((CONCAT44(extraout_var,iVar2) & 0x1ffffffff) == 0x100000001) {
      return Either;
    }
  }
  bVar1 = Type::isSigned((this->super_Expression).type.ptr);
  return (uint)bVar1;
}

Assistant:

Expression::EffectiveSign CallExpression::getEffectiveSignImpl(bool) const {
    if (isSystemCall()) {
        auto& callInfo = std::get<1>(subroutine);
        if (callInfo.subroutine->getEffectiveWidth() == 1)
            return EffectiveSign::Either;
    }
    return type->isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
}